

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMpiHandshake.cpp
# Opt level: O2

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* adios2::helper::HandshakeRank
            (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,string *filename,char mode,int timeoutSeconds,
            MPI_Comm localComm,int verbosity)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer pvVar2;
  long lVar3;
  int *piVar4;
  bool bVar5;
  ostream *poVar6;
  long lVar7;
  istream *piVar8;
  vector<int,_std::allocator<int>_> *i_2;
  pointer piVar9;
  pointer piVar10;
  MPI_Comm poVar11;
  int iVar12;
  int *j;
  int *piVar13;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range3;
  int localRank;
  allocator local_70b;
  allocator local_70a;
  allocator local_709;
  MPI_Comm local_708;
  string line;
  int worldRank;
  int local_6d0;
  int localSize;
  vector<int,_std::allocator<int>_> allLocalRanks;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  long local_690;
  long local_688;
  int worldSize;
  string local_678;
  ifstream fs_1;
  ostream local_648 [504];
  int dims [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream fs;
  
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,3,(allocator_type *)&fs_1);
  local_708 = localComm;
  MPI_Comm_rank(localComm,&localRank);
  MPI_Comm_size(local_708,&localSize);
  MPI_Comm_rank(&ompi_mpi_comm_world,&worldRank);
  MPI_Comm_size(&ompi_mpi_comm_world,&worldSize);
  std::vector<int,_std::allocator<int>_>::vector
            (&allLocalRanks,(long)localSize,(allocator_type *)&fs_1);
  MPI_Gather(&worldRank,1,&ompi_mpi_int,
             allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,1,&ompi_mpi_int,0,local_708);
  local_6d0 = verbosity;
  if (localRank != 0) goto LAB_0013b596;
  std::ofstream::ofstream(&fs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dims,filename,
                 ".");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fs_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dims,mode);
  std::ofstream::open((string *)&fs,(_Ios_Openmode)&fs_1);
  std::__cxx11::string::~string((string *)&fs_1);
  std::__cxx11::string::~string((string *)dims);
  piVar10 = allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (piVar9 = allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar9 != piVar10; piVar9 = piVar9 + 1) {
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&fs,*piVar9);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::ofstream::close();
  if (mode == 'w') {
    for (piVar10 = allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        piVar10 !=
        allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish; piVar10 = piVar10 + 1) {
      _fs_1 = *piVar10;
      std::vector<int,_std::allocator<int>_>::push_back
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,(value_type_conflict1 *)&fs_1);
      std::vector<int,_std::allocator<int>_>::push_back
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1,(value_type_conflict1 *)&fs_1);
    }
    std::ofstream::ofstream(dims);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fs_1,
                   filename,".w.c");
    std::ofstream::open((string *)dims,(_Ios_Openmode)&fs_1);
    std::__cxx11::string::~string((string *)&fs_1);
    std::operator<<((ostream *)dims,"completed");
    std::ofstream::close();
    do {
      while( true ) {
        std::ifstream::ifstream((string *)&fs_1);
        std::operator+(&line,filename,".r.c");
        std::ifstream::open((string *)&fs_1,(_Ios_Openmode)&line);
        std::__cxx11::string::~string((string *)&line);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&fs_1,(string *)&line);
        bVar5 = std::operator!=(&line,"completed");
        if (!bVar5) break;
        std::__cxx11::string::~string((string *)&line);
        std::ifstream::~ifstream((string *)&fs_1);
      }
      std::ifstream::close();
      std::operator+(&local_6b0,filename,".r.c");
      remove((char *)CONCAT44(local_6b0._M_dataplus._M_p._4_4_,(int)local_6b0._M_dataplus._M_p));
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream((string *)&fs_1);
    } while (bVar5);
    std::ifstream::ifstream(&fs_1);
    std::operator+(&line,filename,".r");
    std::ifstream::open((string *)&fs_1,(_Ios_Openmode)&line);
    std::__cxx11::string::~string((string *)&line);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fs_1,(string *)&line);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      pvVar1 = (__return_storage_ptr__->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_6b0._M_dataplus._M_p._0_4_ = std::__cxx11::stoi(&line,(size_t *)0x0,10);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_6b0);
      pvVar2 = (__return_storage_ptr__->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_6b0._M_dataplus._M_p._0_4_ = std::__cxx11::stoi(&line,(size_t *)0x0,10);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2 + 2,(int *)&local_6b0);
    }
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::close();
    std::operator+(&line,filename,".r");
LAB_0013b547:
    remove(line._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&fs_1);
    std::ofstream::~ofstream(dims);
  }
  else if (mode == 'r') {
    for (piVar10 = allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        piVar10 !=
        allLocalRanks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish; piVar10 = piVar10 + 1) {
      _fs_1 = *piVar10;
      std::vector<int,_std::allocator<int>_>::push_back
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,(value_type_conflict1 *)&fs_1);
      std::vector<int,_std::allocator<int>_>::push_back
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2,(value_type_conflict1 *)&fs_1);
    }
    std::ofstream::ofstream(dims);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fs_1,
                   filename,".r.c");
    std::ofstream::open((string *)dims,(_Ios_Openmode)&fs_1);
    std::__cxx11::string::~string((string *)&fs_1);
    std::operator<<((ostream *)dims,"completed");
    std::ofstream::close();
    local_688 = std::chrono::_V2::system_clock::now();
    local_690 = (long)timeoutSeconds;
    do {
      while( true ) {
        std::ifstream::ifstream((string *)&fs_1);
        lVar7 = std::chrono::_V2::system_clock::now();
        if (local_690 < (lVar7 - local_688) / 1000000000) {
          std::__cxx11::string::string((string *)&line,"Helper",&local_709);
          std::__cxx11::string::string((string *)&local_6b0,"adiosMpiHandshake",&local_70a);
          std::__cxx11::string::string((string *)&local_678,"HandshakeRank",&local_70b);
          std::operator+(&local_250,"Mpi handshake timeout for Stream ",filename);
          Throw<std::runtime_error>(&line,&local_6b0,&local_678,&local_250,-1);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_678);
          std::__cxx11::string::~string((string *)&local_6b0);
          std::__cxx11::string::~string((string *)&line);
        }
        std::operator+(&line,filename,".w.c");
        std::ifstream::open((string *)&fs_1,(_Ios_Openmode)&line);
        std::__cxx11::string::~string((string *)&line);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&fs_1,(string *)&line);
        bVar5 = std::operator!=(&line,"completed");
        if (!bVar5) break;
        std::__cxx11::string::~string((string *)&line);
        std::ifstream::~ifstream((string *)&fs_1);
      }
      std::ifstream::close();
      std::operator+(&local_6b0,filename,".w.c");
      remove((char *)CONCAT44(local_6b0._M_dataplus._M_p._4_4_,(int)local_6b0._M_dataplus._M_p));
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream((string *)&fs_1);
    } while (bVar5);
    std::ifstream::ifstream(&fs_1);
    std::operator+(&line,filename,".w");
    std::ifstream::open((string *)&fs_1,(_Ios_Openmode)&line);
    std::__cxx11::string::~string((string *)&line);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fs_1,(string *)&line);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      pvVar1 = (__return_storage_ptr__->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_6b0._M_dataplus._M_p._0_4_ = std::__cxx11::stoi(&line,(size_t *)0x0,10);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_6b0);
      pvVar2 = (__return_storage_ptr__->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_6b0._M_dataplus._M_p._0_4_ = std::__cxx11::stoi(&line,(size_t *)0x0,10);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar2 + 1,(int *)&local_6b0);
    }
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::close();
    std::operator+(&line,filename,".w");
    goto LAB_0013b547;
  }
  std::ofstream::~ofstream(&fs);
  piVar13 = dims;
  if (localRank == 0) {
    for (lVar7 = 2; lVar7 != 0x14; lVar7 = lVar7 + 6) {
      pvVar2 = (__return_storage_ptr__->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *piVar13 = (int)((ulong)(*(long *)((long)&(pvVar2->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data + lVar7 * 4) -
                              *(long *)((long)pvVar2 + lVar7 * 4 + -8)) >> 2);
      std::
      __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
      piVar13 = piVar13 + 1;
    }
  }
LAB_0013b596:
  piVar13 = dims;
  MPI_Bcast(piVar13,3,&ompi_mpi_int,0,local_708);
  if (localRank != 0) {
    for (lVar7 = 0; lVar7 != 0x48; lVar7 = lVar7 + 0x18) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&(((__return_storage_ptr__->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + lVar7),(long)*piVar13);
      piVar13 = piVar13 + 1;
    }
  }
  for (lVar7 = 8; lVar7 != 0x50; lVar7 = lVar7 + 0x18) {
    pvVar2 = (__return_storage_ptr__->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)((long)pvVar2 + lVar7 + -8);
    MPI_Bcast(lVar3,(ulong)(*(long *)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)
                                             ._M_impl.super__Vector_impl_data + lVar7) - lVar3) >> 2
              ,&ompi_mpi_int,0,local_708);
  }
  if (4 < local_6d0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&fs_1);
    poVar6 = std::operator<<(local_648,"World Rank ");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,worldRank);
    poVar6 = std::operator<<(poVar6,": ");
    std::endl<char,std::char_traits<char>>(poVar6);
    local_708 = (MPI_Comm)
                (__return_storage_ptr__->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    iVar12 = 0;
    for (poVar11 = (MPI_Comm)
                   (__return_storage_ptr__->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; poVar11 != local_708;
        poVar11 = poVar11 + 0x18) {
      poVar6 = std::operator<<(local_648,"    ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar12);
      std::operator<<(poVar6,": ");
      piVar4 = *(int **)(poVar11 + 8);
      for (piVar13 = *(int **)poVar11; piVar13 != piVar4; piVar13 = piVar13 + 1) {
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_648,*piVar13);
        std::operator<<(poVar6,", ");
      }
      std::endl<char,std::char_traits<char>>(local_648);
      iVar12 = iVar12 + 1;
    }
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&std::cout,(string *)&fs);
    std::__cxx11::string::~string((string *)&fs);
    std::__cxx11::stringstream::~stringstream((stringstream *)&fs_1);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&allLocalRanks.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

const std::vector<std::vector<int>> HandshakeRank(const std::string &filename, const char mode,
                                                  const int timeoutSeconds, MPI_Comm localComm,
                                                  int verbosity)
{
    std::vector<std::vector<int>> ret(3);

    int localRank;
    int localSize;
    int worldRank;
    int worldSize;

    MPI_Comm_rank(localComm, &localRank);
    MPI_Comm_size(localComm, &localSize);

    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
    MPI_Comm_size(MPI_COMM_WORLD, &worldSize);

    std::vector<int> allLocalRanks(localSize);

    MPI_Gather(&worldRank, 1, MPI_INT, allLocalRanks.data(), 1, MPI_INT, 0, localComm);

    if (localRank == 0)
    {
        std::ofstream fs;
        fs.open(filename + "." + mode);
        for (auto rank : allLocalRanks)
        {
            fs << rank << std::endl;
        }
        fs.close();

        if (mode == 'r')
        {

            for (auto i : allLocalRanks)
            {
                ret[0].push_back(i);
                ret[2].push_back(i);
            }

            std::ofstream fsc;
            fsc.open(filename + ".r.c");
            fsc << "completed";
            fsc.close();

            auto startTime = std::chrono::system_clock::now();
            while (true)
            {
                std::ifstream fs;
                try
                {
                    auto nowTime = std::chrono::system_clock::now();
                    auto duration =
                        std::chrono::duration_cast<std::chrono::seconds>(nowTime - startTime);
                    if (duration.count() > timeoutSeconds)
                    {
                        helper::Throw<std::runtime_error>(
                            "Helper", "adiosMpiHandshake", "HandshakeRank",
                            "Mpi handshake timeout for Stream " + filename);
                    }

                    fs.open(filename + ".w.c");
                    std::string line;
                    std::getline(fs, line);
                    if (line != "completed")
                    {
                        continue;
                    }
                    fs.close();
                    remove((filename + ".w.c\0").c_str());
                    break;
                }
                catch (...)
                {
                    continue;
                }
            }

            std::ifstream fs;
            fs.open(filename + ".w");
            for (std::string line; std::getline(fs, line);)
            {
                ret[0].push_back(std::stoi(line));
                ret[1].push_back(std::stoi(line));
            }
            fs.close();
            remove((filename + ".w\0").c_str());
        }
        else if (mode == 'w')
        {
            for (auto i : allLocalRanks)
            {
                ret[0].push_back(i);
                ret[1].push_back(i);
            }

            std::ofstream fsc;
            fsc.open(filename + ".w.c");
            fsc << "completed";
            fsc.close();

            while (true)
            {
                std::ifstream fs;
                try
                {
                    fs.open(filename + ".r.c");
                    std::string line;
                    std::getline(fs, line);
                    if (line != "completed")
                    {
                        continue;
                    }
                    fs.close();
                    remove((filename + ".r.c\0").c_str());
                    break;
                }
                catch (...)
                {
                    continue;
                }
            }

            std::ifstream fs;
            fs.open(filename + ".r");
            for (std::string line; std::getline(fs, line);)
            {
                ret[0].push_back(std::stoi(line));
                ret[2].push_back(std::stoi(line));
            }
            fs.close();
            remove((filename + ".r\0").c_str());
        }
    }

    int dims[3];

    if (localRank == 0)
    {
        for (int i = 0; i < 3; ++i)
        {
            dims[i] = static_cast<int>(ret[i].size());
            std::sort(ret[i].begin(), ret[i].end());
        }
    }

    MPI_Bcast(dims, 3, MPI_INT, 0, localComm);

    if (localRank != 0)
    {
        for (int i = 0; i < 3; ++i)
        {
            ret[i].resize(dims[i]);
        }
    }

    for (int i = 0; i < 3; ++i)
    {
        MPI_Bcast(ret[i].data(), static_cast<int>(ret[i].size()), MPI_INT, 0, localComm);
    }

    if (verbosity >= 5)
    {
        std::stringstream output;
        output << "World Rank " << worldRank << ": " << std::endl;
        int s = 0;
        for (const auto &i : ret)
        {
            output << "    " << s << ": ";
            for (const auto &j : i)
            {
                output << j << ", ";
            }
            output << std::endl;
            ++s;
        }
        std::cout << output.str();
    }

    return ret;
}